

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool Catch::operator<(TestCaseInfo *lhs,TestCaseInfo *rhs)

{
  StringRef rhs_00;
  int iVar1;
  StringRef *in_RSI;
  string *in_RDI;
  bool bVar2;
  int cmpClassName;
  int cmpName;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  iVar1 = std::__cxx11::string::compare(in_RDI);
  if (iVar1 == 0) {
    rhs_00.m_size._0_7_ = in_stack_fffffffffffffff8;
    rhs_00.m_start = (char *)in_RDI;
    rhs_00.m_size._7_1_ = in_stack_ffffffffffffffff;
    iVar1 = StringRef::compare(in_RSI,rhs_00);
    if (iVar1 == 0) {
      bVar2 = std::operator<((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)in_RDI,
                             (vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)in_RSI);
    }
    else {
      bVar2 = iVar1 < 0;
    }
  }
  else {
    bVar2 = iVar1 < 0;
  }
  return bVar2;
}

Assistant:

bool operator<( TestCaseInfo const& lhs, TestCaseInfo const& rhs ) {
        // We want to avoid redoing the string comparisons multiple times,
        // so we store the result of a three-way comparison before using
        // it in the actual comparison logic.
        const auto cmpName = lhs.name.compare( rhs.name );
        if ( cmpName != 0 ) {
            return cmpName < 0;
        }
        const auto cmpClassName = lhs.className.compare( rhs.className );
        if ( cmpClassName != 0 ) {
            return cmpClassName < 0;
        }
        return lhs.tags < rhs.tags;
    }